

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O0

void __thiscall cppforth::Forth::OpenFilesSqeeze(Forth *this)

{
  size_type sVar1;
  reference pvVar2;
  ulong uVar3;
  reference __b;
  int local_14;
  int it;
  Forth *this_local;
  
  sVar1 = std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>::size
                    (&this->OpenFiles);
  local_14 = (int)sVar1;
  while (local_14 = local_14 + -1, -1 < local_14) {
    pvVar2 = std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>::
             operator[](&this->OpenFiles,(long)local_14);
    std::
    __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&pvVar2->fileObject);
    uVar3 = std::fstream::is_open();
    if ((uVar3 & 1) == 0) {
      sVar1 = std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>::
              size(&this->OpenFiles);
      if (local_14 < (int)sVar1 + -1) {
        pvVar2 = std::
                 vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>::
                 operator[](&this->OpenFiles,(long)local_14);
        sVar1 = std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>
                ::size(&this->OpenFiles);
        __b = std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>::
              operator[](&this->OpenFiles,sVar1 - 1);
        std::swap<cppforth::Forth::ForthFile>(pvVar2,__b);
      }
      sVar1 = std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>::
              size(&this->OpenFiles);
      std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>::resize
                (&this->OpenFiles,sVar1 - 1);
    }
  }
  return;
}

Assistant:

void OpenFilesSqeeze(){
	for (int it = static_cast<int>(OpenFiles.size()) - 1; it >= 0; --it){
		if (!(OpenFiles[it].fileObject->is_open())){
			if (it < (static_cast<int>(OpenFiles.size()) - 1)){
				std::swap(OpenFiles[it], OpenFiles[OpenFiles.size() - 1]);
			}
			OpenFiles.resize(OpenFiles.size() - 1);
		}
	}
}